

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

lu_byte luaV_finishget(lua_State *L,TValue *t,TValue *key,StkId val,lu_byte tag)

{
  lu_byte lVar1;
  TValue *local_48;
  TValue *local_40;
  TValue *tm;
  int loop;
  lu_byte tag_local;
  StkId val_local;
  TValue *key_local;
  TValue *t_local;
  lua_State *L_local;
  
  tm._0_4_ = 0;
  tm._7_1_ = tag;
  key_local = t;
  while( true ) {
    if (1999 < (int)tm) {
      luaG_runerror(L,"\'__index\' chain too long; possible loop");
    }
    if (tm._7_1_ == 0x30) {
      local_40 = luaT_gettmbyobj(L,key_local,TM_INDEX);
      if ((local_40->tt_ & 0xf) == 0) {
        luaG_typeerror(L,key_local,"index");
      }
    }
    else {
      if ((*(long *)((key_local->value_).f + 0x20) == 0) ||
         ((*(byte *)(*(long *)((key_local->value_).f + 0x20) + 10) & 1) != 0)) {
        local_48 = (TValue *)0x0;
      }
      else {
        local_48 = luaT_gettm(*(Table **)((key_local->value_).f + 0x20),TM_INDEX,L->l_G->tmname[0]);
      }
      local_40 = local_48;
      if (local_48 == (TValue *)0x0) {
        (val->val).tt_ = '\0';
        return '\0';
      }
    }
    if ((local_40->tt_ & 0xf) == 6) {
      lVar1 = luaT_callTMres(L,local_40,key_local,key,val);
      return lVar1;
    }
    key_local = local_40;
    if (local_40->tt_ == 'E') {
      tm._7_1_ = luaH_get((Table *)(local_40->value_).gc,key,&val->val);
    }
    else {
      tm._7_1_ = 0x30;
    }
    if ((tm._7_1_ & 0xf) != 0) break;
    tm._0_4_ = (int)tm + 1;
  }
  return tm._7_1_;
}

Assistant:

lu_byte luaV_finishget (lua_State *L, const TValue *t, TValue *key,
                                      StkId val, lu_byte tag) {
  int loop;  /* counter to avoid infinite loops */
  const TValue *tm;  /* metamethod */
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    if (tag == LUA_VNOTABLE) {  /* 't' is not a table? */
      lua_assert(!ttistable(t));
      tm = luaT_gettmbyobj(L, t, TM_INDEX);
      if (l_unlikely(notm(tm)))
        luaG_typeerror(L, t, "index");  /* no metamethod */
      /* else will try the metamethod */
    }
    else {  /* 't' is a table */
      tm = fasttm(L, hvalue(t)->metatable, TM_INDEX);  /* table's metamethod */
      if (tm == NULL) {  /* no metamethod? */
        setnilvalue(s2v(val));  /* result is nil */
        return LUA_VNIL;
      }
      /* else will try the metamethod */
    }
    if (ttisfunction(tm)) {  /* is metamethod a function? */
      tag = luaT_callTMres(L, tm, t, key, val);  /* call it */
      return tag;  /* return tag of the result */
    }
    t = tm;  /* else try to access 'tm[key]' */
    luaV_fastget(t, key, s2v(val), luaH_get, tag);
    if (!tagisempty(tag))
      return tag;  /* done */
    /* else repeat (tail call 'luaV_finishget') */
  }
  luaG_runerror(L, "'__index' chain too long; possible loop");
  return 0;  /* to avoid warnings */
}